

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O1

ktx_size_t ktxTexture_doCalcFaceLodSize(ktxTexture *This,ktx_uint32_t level,ktxFormatVersionEnum fv)

{
  ktx_size_t kVar1;
  
  if ((This->isCubemap == true) && (This->isArray == false)) {
    kVar1 = ktxTexture_calcImageSize(This,level,fv);
    return kVar1;
  }
  kVar1 = ktxTexture_calcLevelSize(This,level,fv);
  return kVar1;
}

Assistant:

ktx_size_t
ktxTexture_doCalcFaceLodSize(ktxTexture* This, ktx_uint32_t level,
                             ktxFormatVersionEnum fv)
{
    /*
     * For non-array cubemaps this is the size of a face. For everything
     * else it is the size of the level.
     */
    if (This->isCubemap && !This->isArray)
        return ktxTexture_calcImageSize(This, level, fv);
    else
        return ktxTexture_calcLevelSize(This, level, fv);
}